

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O2

int ImfHeaderIntAttribute(ImfHeader *hdr,char *name,int *value)

{
  TypedAttribute<int> *pTVar1;
  
  pTVar1 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<int>>((Header *)hdr,name);
  *value = pTVar1->_value;
  return 1;
}

Assistant:

int
ImfHeaderIntAttribute (const ImfHeader* hdr, const char name[], int* value)
{
    try
    {
        *value =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::IntAttribute> (
                    name)
                .value ();
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}